

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

index_pointer __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::insert_into_leaf<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
          (hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
           *this,transaction_base *transaction,index_pointer *existing_leaf,
          pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *new_leaf,
          hash_type existing_hash,hash_type hash,uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents)

{
  index_pointer iVar1;
  internal_node *piVar2;
  address a;
  address b;
  ulong existing_hash_00;
  ulong new_hash;
  index_pointer local_48;
  ulong local_40;
  index_pointer leaf_ptr;
  
  if (shifts < 0x42) {
    new_hash = (ulong)((uint)hash & 0x3f);
    existing_hash_00 = (ulong)((uint)existing_hash & 0x3f);
    if (new_hash == existing_hash_00) {
      leaf_ptr = insert_into_leaf<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
                           (this,transaction,existing_leaf,new_leaf,existing_hash >> 6,hash >> 6,
                            shifts + 6,parents);
      piVar2 = details::internal_node::
               allocate<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
                         (*(chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>
                            **)(this + 8),&leaf_ptr,new_hash);
      local_40 = 0;
      local_48.internal_ = piVar2 | 3;
    }
    else {
      local_48.addr_ =
           store_leaf_node<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
                     (this,transaction,new_leaf,parents);
      piVar2 = details::internal_node::
               allocate<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
                         (*(chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>
                            **)(this + 8),existing_leaf,&local_48,existing_hash_00,new_hash);
      local_40 = (ulong)(existing_hash_00 <= new_hash);
      local_48.internal_ = piVar2 | 3;
    }
  }
  else {
    a = details::index_pointer::to_address((index_pointer *)&existing_leaf->addr_);
    b = store_leaf_node<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
                  (this,transaction,new_leaf,parents);
    details::linear_node::allocate((linear_node *)&local_48.addr_,a,b);
    iVar1 = local_48;
    local_48.internal_ = (internal_node *)0x0;
    std::
    unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
    ::~unique_ptr((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                   *)&local_48.addr_);
    local_40 = 1;
    local_48.internal_ = iVar1.internal_ | 3;
  }
  iVar1 = local_48;
  array_stack<pstore::index::details::parent_type,_13UL>::push
            (parents.ptr_,(value_type *)&local_48.addr_);
  return (index_pointer)iVar1.internal_;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_into_leaf (
            transaction_base & transaction, index_pointer const & existing_leaf,
            OtherValueType const & new_leaf, hash_type existing_hash, hash_type hash,
            unsigned shifts, gsl::not_null<parent_stack *> parents) -> index_pointer {

            if (details::depth_is_internal_node (shifts)) {
                auto const new_hash = hash & details::hash_index_mask;
                auto const old_hash = existing_hash & details::hash_index_mask;
                if (new_hash != old_hash) {
                    address const leaf_addr =
                        this->store_leaf_node (transaction, new_leaf, parents);
                    auto const internal_ptr = index_pointer{
                        internal_node::allocate (internals_container_.get (), existing_leaf,
                                                 index_pointer{leaf_addr}, old_hash, new_hash)};
                    parents->push (details::parent_type{
                        internal_ptr, internal_node::get_new_index (new_hash, old_hash)});
                    return internal_ptr;
                }

                // We've found a (partial) hash collision. Replace this leaf node with an internal
                // node. The existing key must be replaced with a sub-hash table and the next 6 bit
                // hash of the existing key computed. If there's still a collision, we repeat the
                // process. The new and existing keys are then inserted in the new sub-hash table.
                // As long as the partial hashes match, we have to create single element internal
                // nodes to represent them. This should happen very rarely with a reasonably good
                // hash function.

                shifts += details::hash_index_bits;
                hash >>= details::hash_index_bits;
                existing_hash >>= details::hash_index_bits;

                index_pointer const leaf_ptr = this->insert_into_leaf (
                    transaction, existing_leaf, new_leaf, existing_hash, hash, shifts, parents);
                auto const internal_ptr = index_pointer{
                    internal_node::allocate (internals_container_.get (), leaf_ptr, old_hash)};
                parents->push (details::parent_type{internal_ptr, 0U});
                return internal_ptr;
            }

            // We ran out of hash bits: create a new linear node.
            auto const linear_ptr = index_pointer{
                linear_node::allocate (existing_leaf.to_address (),
                                       this->store_leaf_node (transaction, new_leaf, parents))
                    .release ()};
            parents->push (details::parent_type{linear_ptr, 1U});
            return linear_ptr;
        }